

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  ushort uVar1;
  CType *pCVar2;
  IRRef1 IVar3;
  undefined2 uVar4;
  TRef TVar5;
  CType *pCVar6;
  GCcdata *pGVar7;
  IRType local_29c;
  IRType t;
  CType *cct;
  GCobj *pGStack_288;
  CTSize ofs;
  GCstr *str;
  ulong uStack_278;
  TRef tr;
  GCudata *ud;
  CType *s;
  void *svisnz;
  CTState *pCStack_258;
  CTypeID sid;
  CTState *cts;
  cTValue *sval_local;
  TRef sp_local;
  TRef dp_local;
  CType *d_local;
  jit_State *J_local;
  CType *ct;
  CTState *local_220;
  GCudata *local_218;
  CTState *local_210;
  undefined2 local_206;
  undefined2 local_204;
  ushort local_202;
  CType *local_200;
  undefined2 local_1f6;
  undefined2 local_1f4;
  undefined2 local_1f2;
  CType *local_1f0;
  undefined2 local_1e6;
  undefined2 local_1e4;
  ushort local_1e2;
  CType *local_1e0;
  undefined2 local_1d6;
  undefined2 local_1d4;
  ushort local_1d2;
  CType *local_1d0;
  undefined2 local_1c6;
  undefined2 local_1c4;
  ushort local_1c2;
  CType *local_1c0;
  IRRef1 local_1b6;
  IRRef1 local_1b4;
  undefined2 local_1b2;
  jit_State *local_1b0;
  undefined2 local_1a6;
  undefined2 local_1a4;
  undefined2 local_1a2;
  CType *local_1a0;
  IRRef1 local_196;
  IRRef1 local_194;
  undefined2 local_192;
  jit_State *local_190;
  undefined2 local_186;
  undefined2 local_184;
  undefined2 local_182;
  CType *local_180;
  undefined2 local_176;
  undefined2 local_174;
  undefined2 local_172;
  CType *local_170;
  undefined2 local_166;
  IRRef1 local_164;
  undefined2 local_162;
  jit_State *local_160;
  GCudata *local_158;
  CTState *local_150;
  jit_State *local_148;
  CTState *local_140;
  CType *local_138;
  CTState *local_130;
  GCudata *local_128;
  CTState *local_120;
  GCudata *local_118;
  CTState *local_110;
  uint local_104;
  CTState *local_100;
  uint local_f4;
  CTState *local_f0;
  uint local_e4;
  CTState *local_e0;
  uint local_d4;
  CTState *local_d0;
  uint local_c4;
  CTState *local_c0;
  uint local_b4;
  CTState *local_b0;
  uint local_a4;
  CTState *local_a0;
  CTypeID local_94;
  CTState *local_90;
  CTypeID local_84;
  CTState *local_80;
  uint local_74;
  CTState *local_70;
  uint local_64;
  CTState *local_60;
  uint local_54;
  CTState *local_50;
  uint local_44;
  CTState *local_40;
  uint local_34;
  CTState *local_30;
  uint local_24;
  CTState *local_20;
  uint local_14;
  CTState *local_10;
  
  pCStack_258 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  svisnz._4_4_ = 0x11;
  s = (CType *)0x0;
  cts = (CTState *)sval;
  sval_local._0_4_ = sp;
  sval_local._4_4_ = dp;
  _sp_local = d;
  d_local = (CType *)J;
  if ((sp >> 0x18 & 0x1f) - 0xf < 5) {
    svisnz._4_4_ = 9;
    s = (CType *)(long)(int)(uint)(((sval->u64 & 0x7fffffffffffffff) == 0 ^ 0xffU) & 1);
  }
  else if ((sp & 0x1f000000) == 0xe000000) {
    svisnz._4_4_ = 0xe;
    s = (CType *)(long)(int)(uint)(((sval->u64 & 0x7fffffffffffffff) == 0 ^ 0xffU) & 1);
  }
  else if ((sp >> 0x18 & 0x1f) - 1 < 2) {
    sval_local._0_4_ = lj_ir_kint(J,(uint)((sp & 0x1f000000) == 0x2000000));
    svisnz._4_4_ = 3;
  }
  else if ((sp & 0x1f000000) == 0) {
    sval_local._0_4_ = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
  }
  else {
    IVar3 = (IRRef1)sp;
    if ((sp & 0x1f000000) == 0xc000000) {
      uStack_278 = sval->u64 & 0x7fffffffffff;
      if ((*(char *)(uStack_278 + 10) == '\x01') || (*(char *)(uStack_278 + 10) == '\x03')) {
        local_162 = 0x4510;
        local_166 = 0xc;
        (J->fold).ins.field_0.ot = 0x4510;
        (J->fold).ins.field_0.op1 = IVar3;
        (J->fold).ins.field_0.op2 = 0xc;
        local_164 = IVar3;
        local_160 = J;
        str._4_4_ = lj_opt_fold(J);
        pCVar2 = d_local;
        uVar4 = (undefined2)str._4_4_;
        TVar5 = lj_ir_kint((jit_State *)d_local,(uint)*(byte *)(uStack_278 + 10));
        local_170 = pCVar2;
        local_172 = 0x893;
        local_176 = (undefined2)TVar5;
        *(undefined2 *)((long)&pCVar2[7].name.gcptr64 + 4) = 0x893;
        *(undefined2 *)&pCVar2[7].name.gcptr64 = uVar4;
        *(undefined2 *)((long)&pCVar2[7].name.gcptr64 + 2) = local_176;
        local_174 = uVar4;
        lj_opt_fold((jit_State *)d_local);
        local_184 = (undefined2)(TRef)sval_local;
        local_186 = 0x13;
        if (*(char *)(uStack_278 + 10) == '\x01') {
          local_186 = 0xd;
        }
        local_180 = d_local;
        local_182 = 0x4509;
        *(undefined2 *)((long)&d_local[7].name.gcptr64 + 4) = 0x4509;
        *(undefined2 *)&d_local[7].name.gcptr64 = local_184;
        *(undefined2 *)((long)&d_local[7].name.gcptr64 + 2) = local_186;
        sval_local._0_4_ = lj_opt_fold((jit_State *)d_local);
      }
      else {
        TVar5 = lj_ir_kint64(J,0x30);
        local_192 = 0x2909;
        local_196 = (IRRef1)TVar5;
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar3;
        (J->fold).ins.field_0.op2 = local_196;
        local_194 = IVar3;
        local_190 = J;
        sval_local._0_4_ = lj_opt_fold((jit_State *)d_local);
      }
    }
    else {
      if ((sp & 0x1f000000) != 0x4000000) {
        if ((sp & 0x1f000000) == 0x3000000) {
          lj_trace_err(J,LJ_TRERR_NYICONV);
        }
        pGVar7 = argv2cdata(J,sp,sval);
        svisnz._4_4_ = (uint)pGVar7->ctypeid;
        local_220 = pCStack_258;
        local_b0 = pCStack_258;
        local_60 = pCStack_258;
        J_local = (jit_State *)(pCStack_258->tab + svisnz._4_4_);
        while ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 8) {
          local_140 = pCStack_258;
          local_148 = J_local;
          local_d0 = pCStack_258;
          local_d4 = (uint)(J_local->cur).nextgc.gcptr64 & 0xffff;
          local_40 = pCStack_258;
          J_local = (jit_State *)(pCStack_258->tab + local_d4);
          local_44 = local_d4;
        }
        ud = (GCudata *)J_local;
        s = (CType *)(((ulong)cts->tab & 0x7fffffffffff) + 0x10);
        ct._4_4_ = svisnz._4_4_;
        local_b4 = svisnz._4_4_;
        local_64 = svisnz._4_4_;
        if ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 6) {
          svisnz._4_4_ = lj_ctype_intern(pCStack_258,(svisnz._4_4_ | 0x30000) + 0x20000000,8);
          local_90 = pCStack_258;
          local_80 = pCStack_258;
          ud = (GCudata *)(pCStack_258->tab + svisnz._4_4_);
          local_29c = IRT_P64;
          local_94 = svisnz._4_4_;
          local_84 = svisnz._4_4_;
        }
        else {
          local_29c = crec_ct2irt(pCStack_258,(CType *)J_local);
        }
        pCVar2 = d_local;
        uVar1 = (ushort)local_29c;
        uVar4 = (undefined2)(TRef)sval_local;
        if ((uint)(ud->nextgc).gcptr64 >> 0x1c == 2) {
          local_1c2 = uVar1 | 0x4500;
          local_1c0 = d_local;
          local_1c6 = 0x15;
          *(ushort *)((long)&d_local[7].name.gcptr64 + 4) = local_1c2;
          *(undefined2 *)&d_local[7].name.gcptr64 = uVar4;
          *(undefined2 *)((long)&d_local[7].name.gcptr64 + 2) = 0x15;
          local_1c4 = uVar4;
          sval_local._0_4_ = lj_opt_fold((jit_State *)d_local);
          if (((ud->nextgc).gcptr64 & 0xf0800000) != 0x20800000) goto LAB_001b1077;
          s = *(CType **)s;
          local_210 = pCStack_258;
          local_218 = ud;
          do {
            local_150 = pCStack_258;
            local_158 = local_218;
            local_c4 = (uint)(local_218->nextgc).gcptr64 & 0xffff;
            local_c0 = pCStack_258;
            local_50 = pCStack_258;
            local_218 = (GCudata *)(pCStack_258->tab + local_c4);
          } while ((uint)(local_218->nextgc).gcptr64 >> 0x1c == 8);
          ud = local_218;
          if ((uint)(local_218->nextgc).gcptr64 >> 0x1c == 5) {
            local_110 = pCStack_258;
            local_104 = (uint)(local_218->nextgc).gcptr64 & 0xffff;
            local_100 = pCStack_258;
            local_10 = pCStack_258;
            ud = (GCudata *)(pCStack_258->tab + local_104);
            local_118 = local_218;
            local_14 = local_104;
          }
          local_54 = local_c4;
          local_29c = crec_ct2irt(pCStack_258,(CType *)ud);
        }
        else {
          if ((local_29c == IRT_I64) || (local_29c == IRT_U64)) {
            local_1d2 = uVar1 | 0x4500;
            local_1d0 = d_local;
            local_1d6 = 0x17;
            *(ushort *)((long)&d_local[7].name.gcptr64 + 4) = local_1d2;
            *(undefined2 *)&d_local[7].name.gcptr64 = uVar4;
            *(undefined2 *)((long)&d_local[7].name.gcptr64 + 2) = 0x17;
            local_1d4 = uVar4;
            sval_local._0_4_ = lj_opt_fold((jit_State *)d_local);
            goto LAB_001b1077;
          }
          if ((local_29c == IRT_INT) || (local_29c == IRT_U32)) {
            if ((uint)(ud->nextgc).gcptr64 >> 0x1c == 5) {
              local_120 = pCStack_258;
              local_128 = ud;
              local_f4 = (uint)(ud->nextgc).gcptr64 & 0xffff;
              local_f0 = pCStack_258;
              local_20 = pCStack_258;
              ud = (GCudata *)(pCStack_258->tab + local_f4);
              local_24 = local_f4;
            }
            local_1e2 = uVar1 | 0x4500;
            local_1e0 = d_local;
            local_1e6 = 0x16;
            *(ushort *)((long)&d_local[7].name.gcptr64 + 4) = local_1e2;
            *(undefined2 *)&d_local[7].name.gcptr64 = uVar4;
            *(undefined2 *)((long)&d_local[7].name.gcptr64 + 2) = 0x16;
            local_1e4 = uVar4;
            sval_local._0_4_ = lj_opt_fold((jit_State *)d_local);
            goto LAB_001b1077;
          }
          TVar5 = lj_ir_kint64((jit_State *)d_local,0x10);
          local_1f0 = pCVar2;
          local_1f2 = 0x2909;
          local_1f6 = (undefined2)TVar5;
          *(undefined2 *)((long)&pCVar2[7].name.gcptr64 + 4) = 0x2909;
          *(undefined2 *)&pCVar2[7].name.gcptr64 = uVar4;
          *(undefined2 *)((long)&pCVar2[7].name.gcptr64 + 2) = local_1f6;
          local_1f4 = uVar4;
          sval_local._0_4_ = lj_opt_fold((jit_State *)d_local);
        }
        if (((uint)(ud->nextgc).gcptr64 >> 0x1c == 0) && (local_29c != IRT_CDATA)) {
          local_202 = (ushort)local_29c | 0x4600;
          local_200 = d_local;
          local_204 = (undefined2)(TRef)sval_local;
          local_206 = 0;
          *(ushort *)((long)&d_local[7].name.gcptr64 + 4) = local_202;
          *(undefined2 *)&d_local[7].name.gcptr64 = local_204;
          *(undefined2 *)((long)&d_local[7].name.gcptr64 + 2) = 0;
          sval_local._0_4_ = lj_opt_fold((jit_State *)d_local);
        }
        goto LAB_001b1077;
      }
      if (d->info >> 0x1c == 5) {
        pGStack_288 = (GCobj *)(sval->u64 & 0x7fffffffffff);
        pCVar6 = lj_ctype_getfieldq(pCStack_258,d,&pGStack_288->str,(CTSize *)((long)&cct + 4),
                                    (CTInfo *)0x0);
        pCVar2 = d_local;
        uVar4 = (undefined2)(TRef)sval_local;
        TVar5 = lj_ir_kgc((jit_State *)d_local,pGStack_288,IRT_STR);
        local_1a0 = pCVar2;
        local_1a2 = 0x884;
        local_1a6 = (undefined2)TVar5;
        *(undefined2 *)((long)&pCVar2[7].name.gcptr64 + 4) = 0x884;
        *(undefined2 *)&pCVar2[7].name.gcptr64 = uVar4;
        *(undefined2 *)((long)&pCVar2[7].name.gcptr64 + 2) = local_1a6;
        local_1a4 = uVar4;
        lj_opt_fold((jit_State *)d_local);
        if ((pCVar6 != (CType *)0x0) && (pCVar6->info >> 0x1c == 0xb)) {
          s = (CType *)(long)(int)(uint)(cct._4_4_ != 0);
          sval_local._0_4_ = lj_ir_kint((jit_State *)d_local,cct._4_4_);
          svisnz._4_4_ = pCVar6->info & 0xffff;
        }
      }
      else {
        if ((d->info & 0xfc000000) == 0x30000000) {
          lj_trace_err(J,LJ_TRERR_BADTYPE);
        }
        TVar5 = lj_ir_kint64(J,0x18);
        local_1b2 = 0x2909;
        local_1b6 = (IRRef1)TVar5;
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar3;
        (J->fold).ins.field_0.op2 = local_1b6;
        local_1b4 = IVar3;
        local_1b0 = J;
        sval_local._0_4_ = lj_opt_fold((jit_State *)d_local);
        svisnz._4_4_ = 0x15;
      }
    }
  }
  local_a0 = pCStack_258;
  local_a4 = svisnz._4_4_;
  local_70 = pCStack_258;
  local_74 = svisnz._4_4_;
  ud = (GCudata *)(pCStack_258->tab + svisnz._4_4_);
LAB_001b1077:
  if (_sp_local->info >> 0x1c == 5) {
    local_130 = pCStack_258;
    local_138 = _sp_local;
    local_e4 = _sp_local->info & 0xffff;
    local_e0 = pCStack_258;
    local_30 = pCStack_258;
    _sp_local = pCStack_258->tab + local_e4;
    local_34 = local_e4;
  }
  TVar5 = crec_ct_ct((jit_State *)d_local,_sp_local,(CType *)ud,sval_local._4_4_,(TRef)sval_local,s)
  ;
  return TVar5;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE || ud->udtype == UDTYPE_BUFFER) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, ud->udtype));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp,
		  ud->udtype == UDTYPE_IO_FILE ? IRFL_UDATA_FILE :
						 IRFL_SBUF_R);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lj_assertJ(ctype_child(cts, cct)->size == 4,
		   "only 32 bit const supported");  /* NYI */
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else if (tref_islightud(sp)) {
#if LJ_64
    lj_trace_err(J, LJ_TRERR_NYICONV);
#endif
  } else {  /* NYI: tref_istab(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    if (ctype_isfunc(s->info)) {
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      s = ctype_get(cts, sid);
      t = IRT_PTR;
    } else {
      t = crec_ct2irt(cts, s);
    }
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}